

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_replace.h
# Opt level: O0

void absl::StringReplace(string_view s,string_view oldsub,string_view newsub,bool replace_all,
                        string *res)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  const_pointer pvVar4;
  byte in_stack_00000008;
  char *in_stack_00000010;
  size_type pos;
  size_type start_pos;
  size_type in_stack_ffffffffffffff68;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  long local_40;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_20);
  if (bVar1) {
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_10);
    std::basic_string_view<char,_std::char_traits<char>_>::size(&local_10);
    std::__cxx11::string::append(in_stack_00000010,(ulong)pvVar4);
  }
  else {
    local_40 = 0;
    do {
      __str._M_str = in_stack_ffffffffffffff80;
      __str._M_len = (size_t)in_stack_ffffffffffffff78;
      sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find
                        (in_stack_ffffffffffffff70,__str,in_stack_ffffffffffffff68);
      if (sVar2 == 0xffffffffffffffff) break;
      in_stack_ffffffffffffff78 = in_stack_00000010;
      pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_10);
      std::__cxx11::string::append(in_stack_ffffffffffffff78,(ulong)(pvVar4 + local_40));
      in_stack_ffffffffffffff80 = in_stack_00000010;
      pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_30);
      std::basic_string_view<char,_std::char_traits<char>_>::size(&local_30);
      std::__cxx11::string::append(in_stack_ffffffffffffff80,(ulong)pvVar4);
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_20);
      local_40 = sVar2 + sVar3;
    } while ((in_stack_00000008 & 1) != 0);
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_10);
    pvVar4 = pvVar4 + local_40;
    std::basic_string_view<char,_std::char_traits<char>_>::size(&local_10);
    std::__cxx11::string::append(in_stack_00000010,(ulong)pvVar4);
  }
  return;
}

Assistant:

inline void StringReplace(absl::string_view s, absl::string_view oldsub,
                          absl::string_view newsub, bool replace_all,
                          std::string *res) {
  if (oldsub.empty()) {
    res->append(s.data(), s.size());
    return;
  }

  absl::string_view::size_type start_pos = 0;
  do {
    const absl::string_view::size_type pos = s.find(oldsub, start_pos);
    if (pos == absl::string_view::npos) {
      break;
    }
    res->append(s.data() + start_pos, pos - start_pos);
    res->append(newsub.data(), newsub.size());
    start_pos = pos + oldsub.size();
  } while (replace_all);
  res->append(s.data() + start_pos, s.size() - start_pos);
}